

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathEqualNodeSetFloat(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr arg,double f,int neq)

{
  double dVar1;
  xmlNodeSetPtr pxVar2;
  bool bVar3;
  xmlChar *val;
  xmlXPathObjectPtr pxVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = 0;
  if ((((arg->type | XPATH_USERS) == XPATH_XSLT_TREE) &&
      (pxVar2 = arg->nodesetval, iVar5 = 0, pxVar2 != (xmlNodeSetPtr)0x0)) && (0 < pxVar2->nodeNr))
  {
    lVar6 = 0;
    iVar5 = 0;
    do {
      val = xmlNodeGetContent(pxVar2->nodeTab[lVar6]);
      if (val == (xmlChar *)0x0) {
        val = xmlStrdup("");
      }
      if (val != (xmlChar *)0x0) {
        pxVar4 = xmlXPathCacheNewString(ctxt->context,val);
        valuePush(ctxt,pxVar4);
        (*xmlFree)(val);
        xmlXPathNumberFunction(ctxt,1);
        pxVar4 = valuePop(ctxt);
        dVar1 = pxVar4->floatval;
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        if (NAN(dVar1)) {
          if (neq != 0) {
            iVar5 = 1;
          }
        }
        else {
          bVar3 = dVar1 == f;
          if (neq == 0) {
            bVar3 = dVar1 != f;
          }
          if (!bVar3) {
            return 1;
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pxVar2->nodeNr);
  }
  return iVar5;
}

Assistant:

static int
xmlXPathEqualNodeSetFloat(xmlXPathParserContextPtr ctxt,
    xmlXPathObjectPtr arg, double f, int neq) {
  int i, ret=0;
  xmlNodeSetPtr ns;
  xmlChar *str2;
  xmlXPathObjectPtr val;
  double v;

    if ((arg == NULL) ||
	((arg->type != XPATH_NODESET) && (arg->type != XPATH_XSLT_TREE)))
        return(0);

    ns = arg->nodesetval;
    if (ns != NULL) {
	for (i=0;i<ns->nodeNr;i++) {
	    str2 = xmlXPathCastNodeToString(ns->nodeTab[i]);
	    if (str2 != NULL) {
		valuePush(ctxt, xmlXPathCacheNewString(ctxt->context, str2));
		xmlFree(str2);
		xmlXPathNumberFunction(ctxt, 1);
		val = valuePop(ctxt);
		v = val->floatval;
		xmlXPathReleaseObject(ctxt->context, val);
		if (!xmlXPathIsNaN(v)) {
		    if ((!neq) && (v==f)) {
			ret = 1;
			break;
		    } else if ((neq) && (v!=f)) {
			ret = 1;
			break;
		    }
		} else {	/* NaN is unequal to any value */
		    if (neq)
			ret = 1;
		}
	    }
	}
    }

    return(ret);
}